

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Person *p)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"Person{ age: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,p->age);
  poVar1 = std::operator<<(poVar1,", name: ");
  poVar1 = std::operator<<(poVar1,(string *)&p->name);
  poVar1 = std::operator<<(poVar1," }");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Person& p)
{
  return out << "Person{ age: " << p.age << ", name: " << p.name << " }";
}